

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void smooth_pred_4xh(__m128i *pixel,__m128i *wh,__m128i *ww,int h,uint8_t *dst,ptrdiff_t stride,
                    int second_half)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined4 *in_R8;
  long in_R9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i wg_wg;
  int i;
  __m128i d;
  __m128i rep;
  __m128i gat;
  __m128i inc;
  __m128i one;
  __m128i round;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  int local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 *local_2f0;
  undefined4 local_238;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  __m128i sum;
  __m128i b;
  __m128i s;
  __m128i wh_sc;
  __m128i sc_sc;
  
  if ((int)wg_wg[1] == 0) {
    local_3e8 = 0x8000800080008000;
    uStack_3e0 = 0x8000800080008000;
  }
  else {
    local_3e8 = 0x8008800880088008;
    uStack_3e0 = 0x8008800880088008;
  }
  local_348 = local_3e8;
  uStack_340 = uStack_3e0;
  local_358 = 0x100010001000100;
  uStack_350 = 0x100010001000100;
  local_2f0 = in_R8;
  for (local_35c = 0; local_35c < in_ECX; local_35c = local_35c + 1) {
    auVar4._8_8_ = uStack_350;
    auVar4._0_8_ = local_358;
    auVar7 = pshufb(*in_RSI,auVar4);
    auVar3._8_8_ = uStack_350;
    auVar3._0_8_ = local_358;
    auVar8 = pshufb(in_RSI[1],auVar3);
    local_f8 = auVar7._0_2_;
    uStack_f6 = auVar7._2_2_;
    uStack_f4 = auVar7._4_2_;
    uStack_f2 = auVar7._6_2_;
    local_108 = auVar8._0_2_;
    uStack_106 = auVar8._2_2_;
    uStack_104 = auVar8._4_2_;
    uStack_102 = auVar8._6_2_;
    auVar6._2_2_ = local_108;
    auVar6._0_2_ = local_f8;
    auVar6._4_2_ = uStack_f6;
    auVar6._6_2_ = uStack_106;
    auVar6._10_2_ = uStack_104;
    auVar6._8_2_ = uStack_f4;
    auVar6._12_2_ = uStack_f2;
    auVar6._14_2_ = uStack_102;
    auVar7 = pmaddwd(*in_RDI,auVar6);
    auVar2._8_8_ = uStack_340;
    auVar2._0_8_ = local_348;
    auVar8 = pshufb(in_RDI[1],auVar2);
    uVar1 = *(undefined8 *)in_RDI[2];
    local_118 = auVar8._0_2_;
    uStack_116 = auVar8._2_2_;
    uStack_114 = auVar8._4_2_;
    uStack_112 = auVar8._6_2_;
    local_128 = (undefined2)uVar1;
    uStack_126 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_124 = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_122 = (undefined2)((ulong)uVar1 >> 0x30);
    local_3b8._0_4_ = CONCAT22(local_128,local_118);
    local_3b8._0_6_ = CONCAT24(uStack_116,(undefined4)local_3b8);
    local_3b8 = CONCAT26(uStack_126,(undefined6)local_3b8);
    uStack_3b0._0_2_ = uStack_114;
    uStack_3b0._2_2_ = uStack_124;
    uStack_3b0._4_2_ = uStack_112;
    uStack_3b0._6_2_ = uStack_122;
    auVar5._8_8_ = uStack_3b0;
    auVar5._0_8_ = local_3b8;
    auVar8 = pmaddwd(auVar5,*in_RDX);
    local_78 = auVar7._0_4_;
    iStack_74 = auVar7._4_4_;
    iStack_70 = auVar7._8_4_;
    iStack_6c = auVar7._12_4_;
    local_88 = auVar8._0_4_;
    iStack_84 = auVar8._4_4_;
    iStack_80 = auVar8._8_4_;
    iStack_7c = auVar8._12_4_;
    auVar7 = ZEXT416(9);
    local_3c8 = CONCAT44(iStack_74 + iStack_84 + 0x100 >> auVar7,
                         local_78 + local_88 + 0x100 >> auVar7);
    uStack_3c0._0_4_ = iStack_70 + iStack_80 + 0x100 >> auVar7;
    uStack_3c0._4_4_ = iStack_6c + iStack_7c + 0x100 >> auVar7;
    auVar8._8_8_ = uStack_3c0;
    auVar8._0_8_ = local_3c8;
    auVar7._8_8_ = 0xc0804000c080400;
    auVar7._0_8_ = 0xc0804000c080400;
    auVar7 = pshufb(auVar8,auVar7);
    local_238 = auVar7._0_4_;
    *local_2f0 = local_238;
    local_2f0 = (undefined4 *)(in_R9 + (long)local_2f0);
    local_1e8 = (short)local_348;
    sStack_1e6 = (short)((ulong)local_348 >> 0x10);
    sStack_1e4 = (short)((ulong)local_348 >> 0x20);
    sStack_1e2 = (short)((ulong)local_348 >> 0x30);
    sStack_1e0 = (short)uStack_340;
    sStack_1de = (short)((ulong)uStack_340 >> 0x10);
    sStack_1dc = (short)((ulong)uStack_340 >> 0x20);
    sStack_1da = (short)((ulong)uStack_340 >> 0x30);
    local_348 = CONCAT26(sStack_1e2 + 1,
                         CONCAT24(sStack_1e4 + 1,CONCAT22(sStack_1e6 + 1,local_1e8 + 1)));
    uStack_340 = CONCAT26(sStack_1da + 1,
                          CONCAT24(sStack_1dc + 1,CONCAT22(sStack_1de + 1,sStack_1e0 + 1)));
    local_208 = (short)local_358;
    sStack_206 = (short)((ulong)local_358 >> 0x10);
    sStack_204 = (short)((ulong)local_358 >> 0x20);
    sStack_202 = (short)((ulong)local_358 >> 0x30);
    sStack_200 = (short)uStack_350;
    sStack_1fe = (short)((ulong)uStack_350 >> 0x10);
    sStack_1fc = (short)((ulong)uStack_350 >> 0x20);
    sStack_1fa = (short)((ulong)uStack_350 >> 0x30);
    local_358 = CONCAT26(sStack_202 + 0x202,
                         CONCAT24(sStack_204 + 0x202,CONCAT22(sStack_206 + 0x202,local_208 + 0x202))
                        );
    uStack_350 = CONCAT26(sStack_1fa + 0x202,
                          CONCAT24(sStack_1fc + 0x202,
                                   CONCAT22(sStack_1fe + 0x202,sStack_200 + 0x202)));
  }
  return;
}

Assistant:

static inline void smooth_pred_4xh(const __m128i *pixel, const __m128i *wh,
                                   const __m128i *ww, int h, uint8_t *dst,
                                   ptrdiff_t stride, int second_half) {
  const __m128i round = _mm_set1_epi32((1 << SMOOTH_WEIGHT_LOG2_SCALE));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i inc = _mm_set1_epi16(0x202);
  const __m128i gat = _mm_set1_epi32(0xc080400);
  __m128i rep = second_half ? _mm_set1_epi16((short)0x8008)
                            : _mm_set1_epi16((short)0x8000);
  __m128i d = _mm_set1_epi16(0x100);

  for (int i = 0; i < h; ++i) {
    const __m128i wg_wg = _mm_shuffle_epi8(wh[0], d);
    const __m128i sc_sc = _mm_shuffle_epi8(wh[1], d);
    const __m128i wh_sc = _mm_unpacklo_epi16(wg_wg, sc_sc);
    __m128i s = _mm_madd_epi16(pixel[0], wh_sc);

    __m128i b = _mm_shuffle_epi8(pixel[1], rep);
    b = _mm_unpacklo_epi16(b, pixel[2]);
    __m128i sum = _mm_madd_epi16(b, ww[0]);

    sum = _mm_add_epi32(s, sum);
    sum = _mm_add_epi32(sum, round);
    sum = _mm_srai_epi32(sum, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    sum = _mm_shuffle_epi8(sum, gat);
    *(int *)dst = _mm_cvtsi128_si32(sum);
    dst += stride;

    rep = _mm_add_epi16(rep, one);
    d = _mm_add_epi16(d, inc);
  }
}